

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularString::SetAllocatedImpl
          (SingularString *this,Printer *p)

{
  Printer *pPVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Printer *local_18;
  Printer *p_local;
  SingularString *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  bVar2 = FieldGeneratorBase::is_oneof(&this->super_FieldGeneratorBase);
  pPVar1 = local_18;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,
               "\n      if (has_$oneof_name$()) {\n        clear_$oneof_name$();\n      }\n      if (value != nullptr) {\n        set_has_$name_internal$();\n        $field_$.InitAllocated(value, GetArena());\n      }\n    "
              );
    protobuf::io::Printer::SourceLocation::current();
    protobuf::io::Printer::Emit(pPVar1,local_28._M_len,local_28._M_str);
  }
  else {
    bVar2 = protobuf::internal::cpp::HasHasbit((this->super_FieldGeneratorBase).field_);
    pPVar1 = local_18;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_40,
                 "\n      if (value != nullptr) {\n        $set_hasbit$\n      } else {\n        $clear_hasbit$\n      }\n    "
                );
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit(pPVar1,local_40._M_len,local_40._M_str);
    }
    bVar2 = FieldGeneratorBase::is_inlined(&this->super_FieldGeneratorBase);
    pPVar1 = local_18;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_58,"\n      $field_$.SetAllocated(nullptr, value, $set_args$);\n    ");
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit(pPVar1,local_58._M_len,local_58._M_str);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_70,"\n    $field_$.SetAllocated(value, $set_args$);\n  ");
      protobuf::io::Printer::SourceLocation::current();
      protobuf::io::Printer::Emit(pPVar1,local_70._M_len,local_70._M_str);
      bVar2 = EmptyDefault(this);
      pPVar1 = local_18;
      if (bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_88,
                   "\n      if ($pbi$::DebugHardenForceCopyDefaultString() && $field_$.IsDefault()) {\n        $field_$.Set(\"\", $set_args$);\n      }\n    "
                  );
        protobuf::io::Printer::SourceLocation::current();
        protobuf::io::Printer::Emit(pPVar1,local_88._M_len,local_88._M_str);
      }
    }
  }
  return;
}

Assistant:

void SingularString::SetAllocatedImpl(io::Printer* p) const {
  if (is_oneof()) {
    p->Emit(R"cc(
      if (has_$oneof_name$()) {
        clear_$oneof_name$();
      }
      if (value != nullptr) {
        set_has_$name_internal$();
        $field_$.InitAllocated(value, GetArena());
      }
    )cc");
    return;
  }

  if (HasHasbit(field_)) {
    p->Emit(R"cc(
      if (value != nullptr) {
        $set_hasbit$
      } else {
        $clear_hasbit$
      }
    )cc");
  }

  if (is_inlined()) {
    // Currently, string fields with default value can't be inlined.
    p->Emit(R"cc(
      $field_$.SetAllocated(nullptr, value, $set_args$);
    )cc");
    return;
  }

  p->Emit(R"cc(
    $field_$.SetAllocated(value, $set_args$);
  )cc");

  if (EmptyDefault()) {
    p->Emit(R"cc(
      if ($pbi$::DebugHardenForceCopyDefaultString() && $field_$.IsDefault()) {
        $field_$.Set("", $set_args$);
      }
    )cc");
  }
}